

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

sockaddr_in get_address(char *strip,char *strport)

{
  sockaddr_in sVar1;
  int iVar2;
  hostent *phVar3;
  sockaddr_in addr;
  undefined2 local_28;
  ushort uStack_26;
  undefined1 auStack_24 [12];
  
  bzero(&local_28,0x10);
  local_28 = 2;
  iVar2 = atoi(strport);
  uStack_26 = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
  phVar3 = gethostbyname(strip);
  memcpy(auStack_24,*phVar3->h_addr_list,(long)phVar3->h_length);
  sVar1.sin_port = uStack_26;
  sVar1.sin_family = local_28;
  sVar1.sin_addr.s_addr = auStack_24._0_4_;
  sVar1.sin_zero[0] = auStack_24[4];
  sVar1.sin_zero[1] = auStack_24[5];
  sVar1.sin_zero[2] = auStack_24[6];
  sVar1.sin_zero[3] = auStack_24[7];
  sVar1.sin_zero[4] = auStack_24[8];
  sVar1.sin_zero[5] = auStack_24[9];
  sVar1.sin_zero[6] = auStack_24[10];
  sVar1.sin_zero[7] = auStack_24[0xb];
  return sVar1;
}

Assistant:

struct sockaddr_in get_address(char *strip, char *strport) {
    struct sockaddr_in addr;
    bzero(&addr, sizeof(struct sockaddr_in));
    addr.sin_family = PF_INET;
    addr.sin_port = htons((unsigned short)atoi(strport));
    struct hostent *host_info = gethostbyname(strip);
    memcpy(&(addr.sin_addr), host_info->h_addr, (size_t)host_info->h_length);
    return addr;
}